

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.hpp
# Opt level: O2

void __thiscall
ot::commissioner::coap::Coap::RequestsCache::RequestsCache
          (RequestsCache *this,event_base *aEventBase,Action *aRetransmitter)

{
  _Rb_tree_header *p_Var1;
  function<void_(ot::commissioner::Timer_&)> fStack_38;
  
  std::function<void_(ot::commissioner::Timer_&)>::function(&fStack_38,aRetransmitter);
  Timer::Timer(&this->mRetransmissionTimer,aEventBase,&fStack_38,true);
  std::_Function_base::~_Function_base(&fStack_38.super__Function_base);
  p_Var1 = &(this->mContainer)._M_t._M_impl.super__Rb_tree_header;
  (this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

RequestsCache(struct event_base *aEventBase, Timer::Action aRetransmitter)
            : mRetransmissionTimer(aEventBase, aRetransmitter)
        {
        }